

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O1

void __thiscall cmDebugger::SyncEvent::Wait(SyncEvent *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->Mutex;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->Fired == false) {
    do {
      std::condition_variable::wait((unique_lock *)&this->Cv);
    } while (this->Fired != true);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void Wait()
  {
    std::unique_lock<std::mutex> lock(Mutex);
    Cv.wait(lock, [&] { return Fired; });
  }